

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

void __thiscall Server::Server(Server *this,string *alias)

{
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  this->terminate_server = false;
  this->send_to_client = false;
  this->rcv_from_client = false;
  this->server_rcv = false;
  memset(this->buffer,0,0x100);
  (this->msg_for_client).scalar1 = 0;
  (this->msg_for_client).scalar2 = 0;
  (this->msg_from_client).scalar1 = 0;
  (this->msg_from_client).scalar2 = 0;
  std::__cxx11::string::_M_assign((string *)this);
  return;
}

Assistant:

Server::Server(std::string alias)
{
    name = alias;
}